

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::matrix3d>
          (GeomPrimvar *this,double timecode,matrix3d *dest,TimeSampleInterpolationType interp,
          string *err)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  string *args;
  long lVar3;
  double *pdVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Attribute *this_00;
  bool bVar5;
  byte bVar6;
  matrix3d value;
  undefined1 local_e8 [8];
  string local_e0;
  undefined4 local_bc;
  string local_b8;
  string local_98;
  undefined1 local_78 [32];
  double local_58;
  double local_50;
  double dStack_48;
  double local_40;
  double local_38;
  
  bVar6 = 0;
  local_e8 = (undefined1  [8])timecode;
  if (dest == (matrix3d *)0x0) {
joined_r0x001ae747:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    args = err;
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar5 = false;
      }
      else {
        uVar2 = (*pvVar1->type_id)();
        bVar5 = uVar2 == 4;
      }
      if ((bVar5) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001ae747;
    }
    this_00 = &this->_attr;
    uVar2 = Attribute::type_id(this_00);
    bVar5 = IsSupportedGeomPrimvarType(uVar2);
    if (bVar5) {
      local_78._0_8_ = (pointer)0x3ff0000000000000;
      local_78._8_8_ = 0.0;
      local_78._16_8_ = 0.0;
      local_78._24_8_ = 0.0;
      local_58 = 1.0;
      local_50 = 0.0;
      dStack_48 = 0.0;
      local_40 = 0.0;
      local_38 = 1.0;
      bVar5 = Attribute::get<tinyusdz::value::matrix3d>
                        (this_00,(double)local_e8,(matrix3d *)local_78,interp);
      if (bVar5) {
        pdVar4 = (double *)local_78;
        for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
          dest->m[0][0] = *pdVar4;
          pdVar4 = pdVar4 + (ulong)bVar6 * -2 + 1;
          dest = (matrix3d *)((long)dest + ((ulong)bVar6 * -2 + 1) * 8);
        }
        return bVar5;
      }
      if (err == (string *)0x0) {
        return bVar5;
      }
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_e8 + 8),
                 "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                 ,"");
      local_bc = 0x37;
      Attribute::type_name_abi_cxx11_(&local_98,this_00);
      fmt::format<double,unsigned_int,std::__cxx11::string>
                (&local_b8,(fmt *)(local_e8 + 8),(string *)local_e8,(double *)&local_bc,
                 (uint *)&local_98,in_R9);
      std::__cxx11::string::_M_append((char *)err,(ulong)local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
        return bVar5;
      }
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._0_8_ + 1);
      return bVar5;
    }
    if (err != (string *)0x0) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Unsupported type for GeomPrimvar. type = `{}`","");
      Attribute::type_name_abi_cxx11_((string *)(local_e8 + 8),this_00);
      fmt::format<std::__cxx11::string>
                ((string *)local_78,(fmt *)&local_b8,(string *)(local_e8 + 8),args);
      std::__cxx11::string::_M_append((char *)err,local_78._0_8_);
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}